

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O0

void __thiscall Assimp::OptimizeMeshesProcess::OptimizeMeshesProcess(OptimizeMeshesProcess *this)

{
  OptimizeMeshesProcess *this_local;
  
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__OptimizeMeshesProcess_00f3f5d8;
  this->mScene = (aiScene *)0x0;
  std::
  vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
  ::vector(&this->meshes);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(&this->output);
  this->pts = false;
  this->max_verts = 0xffffffff;
  this->max_faces = 0xffffffff;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(&this->merge_list);
  return;
}

Assistant:

OptimizeMeshesProcess::OptimizeMeshesProcess()
    : mScene()
    , pts(false)
    , max_verts( NotSet )
    , max_faces( NotSet ) {
    // empty
}